

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O2

int mriStep_NlsLSolve(N_Vector b,void *arkode_mem)

{
  int iVar1;
  int nonlin_iter;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  
  iVar1 = mriStep_AccessARKODEStepMem(arkode_mem,"mriStep_NlsLSolve",&ark_mem,&step_mem);
  if (iVar1 == 0) {
    iVar1 = SUNNonlinSolGetCurIter(step_mem->NLS,&nonlin_iter);
    if (iVar1 == 0) {
      iVar1 = (*step_mem->lsolve)(ark_mem,b,ark_mem->tcur,ark_mem->ycur,
                                  step_mem->Fsi[step_mem->stage_map[step_mem->istage]],
                                  step_mem->eRNrm,nonlin_iter);
      if (iVar1 < 0) {
        iVar1 = -7;
      }
      else {
        iVar1 = (uint)(iVar1 != 0) << 2;
      }
    }
    else {
      iVar1 = -0x20;
    }
  }
  return iVar1;
}

Assistant:

int mriStep_NlsLSolve(N_Vector b, void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval, nonlin_iter;

  /* access ARKodeMem and ARKodeMRIStepMem structures */
  retval = mriStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* retrieve nonlinear solver iteration from module */
  retval = SUNNonlinSolGetCurIter(step_mem->NLS, &nonlin_iter);
  if (retval != SUN_SUCCESS) { return (ARK_NLS_OP_ERR); }

  /* call linear solver interface, and handle return value */
  retval = step_mem->lsolve(ark_mem, b, ark_mem->tcur, ark_mem->ycur,
                            step_mem->Fsi[step_mem->stage_map[step_mem->istage]],
                            step_mem->eRNrm, nonlin_iter);

  if (retval < 0) { return (ARK_LSOLVE_FAIL); }
  if (retval > 0) { return (CONV_FAIL); }

  return (ARK_SUCCESS);
}